

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

void __thiscall
helics::FederateInfo::loadInfoFromArgs
          (FederateInfo *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  pointer this_00;
  undefined8 uVar2;
  char *in_RDI;
  ParseOutput ret;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  App *in_stack_00000068;
  helicsCLI11App *in_stack_00000070;
  FederateInfo *in_stack_00001f88;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
  *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  string_view in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this_01 = &local_18;
  makeCLIApp(in_stack_00001f88);
  this_00 = CLI::std::
            unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
            operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                        *)0x3fc331);
  CLI::App::allow_extras(&this_00->super_App,true);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x3fc34a);
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    (in_stack_00000070,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_00000068);
  if (PVar1 == PARSE_ERROR) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,in_RDI);
    InvalidParameter::InvalidParameter((InvalidParameter *)this_01,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar2,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
  }
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
            (in_stack_ffffffffffffffb0);
  config_additional((FederateInfo *)in_stack_00000070,in_stack_00000068);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
              this_01);
  return;
}

Assistant:

void FederateInfo::loadInfoFromArgs(std::vector<std::string>& args)
{
    auto app = makeCLIApp();
    app->allow_extras();
    auto ret = app->helics_parse(args);
    if (ret == helicsCLI11App::ParseOutput::PARSE_ERROR) {
        throw helics::InvalidParameter("argument parsing failed");
    }
    config_additional(app.get());
}